

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int disp_nifti_1_header(char *info,nifti_1_header *hp)

{
  int iVar1;
  long lVar2;
  undefined8 in_stack_ffffffffffffff68;
  
  fputs("-------------------------------------------------------\n",_stdout);
  if (info != (char *)0x0) {
    fputs(info,_stdout);
  }
  if (hp == (nifti_1_header *)0x0) {
    fputs(" ** no nifti_1_header to display!\n",_stdout);
    iVar1 = 1;
  }
  else {
    fprintf(_stdout," nifti_1_header :\n    sizeof_hdr     = %d\n    data_type[10]  = ",
            (ulong)(uint)hp->sizeof_hdr);
    print_hex_vals(hp->data_type,10,(FILE *)_stdout);
    fwrite("\n    db_name[18]    = ",0x16,1,_stdout);
    print_hex_vals(hp->db_name,0x12,(FILE *)_stdout);
    fprintf(_stdout,
            "\n    extents        = %d\n    session_error  = %d\n    regular        = 0x%x\n    dim_info       = 0x%x\n"
            ,(ulong)(uint)hp->extents,(ulong)(uint)(int)hp->session_error,
            (ulong)(uint)(int)hp->regular,(ulong)(uint)(int)hp->dim_info);
    fwrite("    dim[8]         =",0x14,1,_stdout);
    lVar2 = 0;
    do {
      fprintf(_stdout," %d",(ulong)(uint)(int)hp->dim[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    fprintf(_stdout,
            "\n    intent_p1      = %f\n    intent_p2      = %f\n    intent_p3      = %f\n    intent_code    = %d\n    datatype       = %d\n    bitpix         = %d\n    slice_start    = %d\n    pixdim[8]      ="
            ,(double)hp->intent_p1,(double)hp->intent_p2,(double)hp->intent_p3,
            (ulong)(uint)(int)hp->intent_code,(ulong)(uint)(int)hp->datatype,
            (ulong)(uint)(int)hp->bitpix,(ulong)(uint)(int)hp->slice_start);
    lVar2 = 0;
    do {
      fprintf(_stdout," %f",(double)hp->pixdim[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    fwrite("\n                    ",0x15,1,_stdout);
    lVar2 = 0;
    do {
      fprintf(_stdout," %f",(double)hp->pixdim[lVar2 + 4]);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    fprintf(_stdout,
            "\n    vox_offset     = %f\n    scl_slope      = %f\n    scl_inter      = %f\n    slice_end      = %d\n    slice_code     = %d\n    xyzt_units     = 0x%x\n    cal_max        = %f\n    cal_min        = %f\n    slice_duration = %f\n    toffset        = %f\n    glmax          = %d\n    glmin          = %d\n"
            ,(double)hp->vox_offset,(double)hp->scl_slope,(double)hp->scl_inter,(double)hp->cal_max,
            (double)hp->cal_min,(double)hp->slice_duration,(double)hp->toffset,
            (ulong)(uint)(int)hp->slice_end,(ulong)(uint)(int)hp->slice_code,
            (ulong)(uint)(int)hp->xyzt_units,(ulong)(uint)hp->glmax,
            CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),hp->glmin));
    fprintf(_stdout,
            "    descrip        = \'%.80s\'\n    aux_file       = \'%.24s\'\n    qform_code     = %d\n    sform_code     = %d\n    quatern_b      = %f\n    quatern_c      = %f\n    quatern_d      = %f\n    qoffset_x      = %f\n    qoffset_y      = %f\n    qoffset_z      = %f\n    srow_x[4]      = %f, %f, %f, %f\n    srow_y[4]      = %f, %f, %f, %f\n    srow_z[4]      = %f, %f, %f, %f\n    intent_name    = \'%-.16s\'\n    magic          = \'%-.4s\'\n"
            ,(double)hp->quatern_b,(double)hp->quatern_c,(double)hp->quatern_d,(double)hp->qoffset_x
            ,(double)hp->qoffset_y,(double)hp->qoffset_z,(double)hp->srow_x[0],(double)hp->srow_x[1]
            ,hp->descrip,hp->aux_file,(ulong)(uint)(int)hp->qform_code,
            (ulong)(uint)(int)hp->sform_code,(double)hp->srow_x[2],(double)hp->srow_x[3],
            (double)hp->srow_y[0],(double)hp->srow_y[1],(double)hp->srow_y[2],(double)hp->srow_y[3],
            (double)hp->srow_z[0],(double)hp->srow_z[1],(double)hp->srow_z[2],(double)hp->srow_z[3],
            hp->intent_name,hp->magic);
    fputs("-------------------------------------------------------\n",_stdout);
    fflush(_stdout);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int disp_nifti_1_header( const char * info, const nifti_1_header * hp )
{
   int c;

   fputs( "-------------------------------------------------------\n", stdout );
   if ( info )  fputs( info, stdout );
   if ( !hp  ){ fputs(" ** no nifti_1_header to display!\n",stdout); return 1; }

   fprintf(stdout," nifti_1_header :\n"
           "    sizeof_hdr     = %d\n"
           "    data_type[10]  = ", hp->sizeof_hdr);
   print_hex_vals(hp->data_type, 10, stdout);
   fprintf(stdout, "\n"
           "    db_name[18]    = ");
   print_hex_vals(hp->db_name, 18, stdout);
   fprintf(stdout, "\n"
           "    extents        = %d\n"
           "    session_error  = %d\n"
           "    regular        = 0x%x\n"
           "    dim_info       = 0x%x\n",
      hp->extents, hp->session_error, hp->regular, hp->dim_info );
   fprintf(stdout, "    dim[8]         =");
   for ( c = 0; c < 8; c++ ) fprintf(stdout," %d", hp->dim[c]);
   fprintf(stdout, "\n"
           "    intent_p1      = %f\n"
           "    intent_p2      = %f\n"
           "    intent_p3      = %f\n"
           "    intent_code    = %d\n"
           "    datatype       = %d\n"
           "    bitpix         = %d\n"
           "    slice_start    = %d\n"
           "    pixdim[8]      =",
           hp->intent_p1, hp->intent_p2, hp->intent_p3, hp->intent_code,
           hp->datatype, hp->bitpix, hp->slice_start);
   /* break pixdim over 2 lines */
   for ( c = 0; c < 4; c++ ) fprintf(stdout," %f", hp->pixdim[c]);
   fprintf(stdout, "\n                    ");
   for ( c = 4; c < 8; c++ ) fprintf(stdout," %f", hp->pixdim[c]);
   fprintf(stdout, "\n"
           "    vox_offset     = %f\n"
           "    scl_slope      = %f\n"
           "    scl_inter      = %f\n"
           "    slice_end      = %d\n"
           "    slice_code     = %d\n"
           "    xyzt_units     = 0x%x\n"
           "    cal_max        = %f\n"
           "    cal_min        = %f\n"
           "    slice_duration = %f\n"
           "    toffset        = %f\n"
           "    glmax          = %d\n"
           "    glmin          = %d\n",
           hp->vox_offset, hp->scl_slope, hp->scl_inter, hp->slice_end,
           hp->slice_code, hp->xyzt_units, hp->cal_max, hp->cal_min,
           hp->slice_duration, hp->toffset, hp->glmax, hp->glmin);
   fprintf(stdout,
           "    descrip        = '%.80s'\n"
           "    aux_file       = '%.24s'\n"
           "    qform_code     = %d\n"
           "    sform_code     = %d\n"
           "    quatern_b      = %f\n"
           "    quatern_c      = %f\n"
           "    quatern_d      = %f\n"
           "    qoffset_x      = %f\n"
           "    qoffset_y      = %f\n"
           "    qoffset_z      = %f\n"
           "    srow_x[4]      = %f, %f, %f, %f\n"
           "    srow_y[4]      = %f, %f, %f, %f\n"
           "    srow_z[4]      = %f, %f, %f, %f\n"
           "    intent_name    = '%-.16s'\n"
           "    magic          = '%-.4s'\n",
           hp->descrip, hp->aux_file, hp->qform_code, hp->sform_code,
           hp->quatern_b, hp->quatern_c, hp->quatern_d,
           hp->qoffset_x, hp->qoffset_y, hp->qoffset_z,
           hp->srow_x[0], hp->srow_x[1], hp->srow_x[2], hp->srow_x[3],
           hp->srow_y[0], hp->srow_y[1], hp->srow_y[2], hp->srow_y[3],
           hp->srow_z[0], hp->srow_z[1], hp->srow_z[2], hp->srow_z[3],
           hp->intent_name, hp->magic);
   fputs( "-------------------------------------------------------\n", stdout );
   fflush(stdout);

   return 0;
}